

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O0

void __thiscall luna::VM::CheckArithType(VM *this,Value *v1,Value *v2,char *op)

{
  undefined8 uVar1;
  long in_RDX;
  long in_RSI;
  char *in_RDI;
  Value *unaff_retaddr;
  Value *in_stack_00000008;
  int in_stack_00000014;
  char *in_stack_00000018;
  RuntimeException *in_stack_00000020;
  pair<const_char_*,_int> pos;
  VM *in_stack_ffffffffffffffd0;
  
  if ((*(int *)(in_RSI + 8) == 2) && (*(int *)(in_RDX + 8) == 2)) {
    return;
  }
  GetCurrentInstructionPos(in_stack_ffffffffffffffd0);
  uVar1 = __cxa_allocate_exception(0x20);
  RuntimeException::RuntimeException
            (in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,
             in_RDI);
  __cxa_throw(uVar1,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
}

Assistant:

void VM::CheckArithType(const Value *v1, const Value *v2, const char *op) const
    {
        if (v1->type_ != ValueT_Number || v2->type_ != ValueT_Number)
        {
            auto pos = GetCurrentInstructionPos();
            throw RuntimeException(pos.first, pos.second, v1, v2, op);
        }
    }